

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_job.h
# Opt level: O2

void __thiscall r_exec::TimeJob::~TimeJob(TimeJob *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

class REPLICODE_EXPORT TimeJob:
    public core::_Object
{
protected:
    TimeJob(uint64_t target_time);
public:
    std::thread *thread = nullptr;
    uint64_t target_time; // absolute deadline; 0 means ASAP.
    virtual bool update() = 0; // next_target: absolute deadline; 0 means no more waiting; return false to shutdown the time core.
    virtual bool is_alive() const
    {
        return true;
    }
    virtual bool shouldRunAgain() const
    {
        return false;
    }
    virtual void report(int64_t lag) const;
}